

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryProvider.h
# Opt level: O2

void __thiscall FIX::DataDictionaryProvider::DataDictionaryProvider(DataDictionaryProvider *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->m_transportDictionaries)._M_t._M_impl.super__Rb_tree_header;
  (this->m_transportDictionaries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_transportDictionaries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_transportDictionaries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_transportDictionaries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_transportDictionaries)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_applicationDictionaries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_applicationDictionaries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->m_applicationDictionaries)._M_t._M_impl.super__Rb_tree_header;
  (this->m_applicationDictionaries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_applicationDictionaries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_applicationDictionaries)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  DataDictionary::DataDictionary(&this->emptyDataDictionary);
  return;
}

Assistant:

DataDictionaryProvider() {}